

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::Image::save(Image *this,char *filename,Format format)

{
  size_t sVar1;
  code *local_70;
  FILE *local_68;
  string local_60;
  string local_40;
  
  if (filename != (char *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(filename);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,filename,filename + sVar1)
    ;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"wb","");
    fopen_unique((phosg *)&local_70,&local_40,&local_60,(FILE *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    save(this,local_68,format);
    if (local_68 != (FILE *)0x0) {
      (*local_70)();
    }
    return;
  }
  save(this,_stdout,format);
  return;
}

Assistant:

void Image::save(const char* filename, Format format) const {
  if (filename) {
    auto f = fopen_unique(filename, "wb");
    this->save(f.get(), format);
  } else {
    this->save(stdout, format);
  }
}